

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O0

uint32_t get32(UNewTrie2 *trie,UChar32 c,UBool fromLSCP)

{
  int local_24;
  int32_t block;
  int32_t i2;
  UBool fromLSCP_local;
  UChar32 c_local;
  UNewTrie2 *trie_local;
  
  if ((c < trie->highStart) || (((c & 0xfffffc00U) == 0xd800 && (fromLSCP == '\0')))) {
    if (((c & 0xfffffc00U) == 0xd800) && (fromLSCP != '\0')) {
      local_24 = (c >> 5) + 0x140;
    }
    else {
      local_24 = trie->index1[c >> 0xb] + (c >> 5 & 0x3fU);
    }
    trie_local._4_4_ = trie->data[(int)(trie->index2[local_24] + (c & 0x1fU))];
  }
  else {
    trie_local._4_4_ = trie->data[trie->dataLength + -4];
  }
  return trie_local._4_4_;
}

Assistant:

static uint32_t
get32(const UNewTrie2 *trie, UChar32 c, UBool fromLSCP) {
    int32_t i2, block;

    if(c>=trie->highStart && (!U_IS_LEAD(c) || fromLSCP)) {
        return trie->data[trie->dataLength-UTRIE2_DATA_GRANULARITY];
    }

    if(U_IS_LEAD(c) && fromLSCP) {
        i2=(UTRIE2_LSCP_INDEX_2_OFFSET-(0xd800>>UTRIE2_SHIFT_2))+
            (c>>UTRIE2_SHIFT_2);
    } else {
        i2=trie->index1[c>>UTRIE2_SHIFT_1]+
            ((c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK);
    }
    block=trie->index2[i2];
    return trie->data[block+(c&UTRIE2_DATA_MASK)];
}